

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O0

int sinfl_decode(uchar **in,uchar *end,sinfl *s,uint *tbl,int bit_len)

{
  uint local_34;
  int len;
  uint key;
  int idx;
  int bit_len_local;
  uint *tbl_local;
  sinfl *s_local;
  uchar *end_local;
  uchar **in_local;
  
  local_34 = tbl[(int)(s->bits & (1 << ((byte)bit_len & 0x1f)) - 1U)];
  if ((local_34 & 0x10) != 0) {
    sinfl_get(in,end,s,bit_len);
    local_34 = tbl[(local_34 >> 0x10) + (s->bits & (1 << ((byte)local_34 & 0xf)) - 1U)];
  }
  sinfl_get(in,end,s,local_34 & 0xf);
  return local_34 >> 0x10 & 0xfff;
}

Assistant:

static int
sinfl_decode(const unsigned char **in, const unsigned char *end,
             struct sinfl *s, const unsigned *tbl, int bit_len) {
  int idx = s->bits & ((1 << bit_len) - 1);
  unsigned key = tbl[idx];
  if (key & 0x10) {
    /* sub-table lookup */
    int len = key & 0x0f;
    sinfl_get(in, end, s, bit_len);
    idx = s->bits & ((1 << len)-1);
    key = tbl[((key >> 16) & 0xffff) + (unsigned)idx];
  }
  sinfl_get(in, end, s, key & 0x0f);
  return (key >> 16) & 0x0fff;
}